

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_transaction.cpp
# Opt level: O2

int CfdCreateSighash(void *handle,int net_type,char *tx_hex_string,char *txid,uint32_t vout,
                    int hash_type,char *pubkey,char *redeem_script,int64_t value_satoshi,
                    int sighash_type,bool sighash_anyone_can_pay,char **sighash)

{
  byte bVar1;
  byte bVar2;
  bool bVar3;
  AddressType AVar4;
  char *pcVar5;
  CfdException *pCVar6;
  string *psVar7;
  WitnessVersion version;
  allocator local_237;
  allocator local_236;
  bool is_bitcoin;
  uint32_t local_234;
  Script local_230;
  void *local_1f8;
  string local_1f0;
  string local_1d0;
  OutPoint local_1b0;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_188;
  SigHashType sighashtype;
  string local_160;
  ByteData sighash_bytes;
  Amount value;
  TransactionContext tx;
  SigHashType local_60;
  SigHashType local_54;
  SigHashType local_48;
  SigHashType local_3c;
  
  local_234 = vout;
  local_1f8 = handle;
  cfd::Initialize();
  bVar3 = cfd::capi::IsEmptyString(tx_hex_string);
  if (bVar3) {
    tx.super_Transaction.super_AbstractTransaction._vptr_AbstractTransaction =
         (_func_int **)0x4fe2f6;
    tx.super_Transaction.super_AbstractTransaction.wally_tx_pointer_._0_4_ = 0x90a;
    tx.super_Transaction.vin_.super__Vector_base<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_2b1128;
    cfd::core::logger::warn<>((CfdSourceLocation *)&tx,"tx is null or empty.");
    pCVar6 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)&tx,"Failed to parameter. tx is null or empty.",(allocator *)&local_230);
    cfd::core::CfdException::CfdException(pCVar6,kCfdIllegalArgumentError,(string *)&tx);
    __cxa_throw(pCVar6,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  bVar3 = cfd::capi::IsEmptyString(txid);
  if (bVar3) {
    tx.super_Transaction.super_AbstractTransaction._vptr_AbstractTransaction =
         (_func_int **)0x4fe2f6;
    tx.super_Transaction.super_AbstractTransaction.wally_tx_pointer_._0_4_ = 0x910;
    tx.super_Transaction.vin_.super__Vector_base<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_2b1128;
    cfd::core::logger::warn<>((CfdSourceLocation *)&tx,"txid is null or empty.");
    pCVar6 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)&tx,"Failed to parameter. txid is null or empty.",(allocator *)&local_230);
    cfd::core::CfdException::CfdException(pCVar6,kCfdIllegalArgumentError,(string *)&tx);
    __cxa_throw(pCVar6,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if (sighash == (char **)0x0) {
    tx.super_Transaction.super_AbstractTransaction._vptr_AbstractTransaction =
         (_func_int **)0x4fe2f6;
    tx.super_Transaction.super_AbstractTransaction.wally_tx_pointer_._0_4_ = 0x916;
    tx.super_Transaction.vin_.super__Vector_base<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_2b1128;
    cfd::core::logger::warn<>((CfdSourceLocation *)&tx,"sighash is null.");
    pCVar6 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)&tx,"Failed to parameter. sighash is null.",(allocator *)&local_230);
    cfd::core::CfdException::CfdException(pCVar6,kCfdIllegalArgumentError,(string *)&tx);
    __cxa_throw(pCVar6,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  AVar4 = cfd::capi::ConvertHashToAddressType(hash_type);
  version = kVersionNone;
  switch(AVar4) {
  case kP2shAddress:
    bVar2 = 1;
    break;
  case kP2pkhAddress:
    bVar2 = 0;
    break;
  case kP2wshAddress:
  case kP2shP2wshAddress:
    bVar1 = 1;
    goto LAB_0039bb99;
  case kP2wpkhAddress:
  case kP2shP2wpkhAddress:
    bVar1 = 0;
LAB_0039bb99:
    bVar2 = 0;
    version = kVersion0;
    goto LAB_0039bba6;
  default:
    tx.super_Transaction.super_AbstractTransaction._vptr_AbstractTransaction =
         (_func_int **)0x4fe2f6;
    tx.super_Transaction.super_AbstractTransaction.wally_tx_pointer_._0_4_ = 0x933;
    tx.super_Transaction.vin_.super__Vector_base<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_2b1128;
    cfd::core::logger::warn<>((CfdSourceLocation *)&tx,"hashtype is illegal.");
    pCVar6 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)&tx,"Failed to parameter. hashtype is illegal.",(allocator *)&local_230);
    cfd::core::CfdException::CfdException(pCVar6,kCfdIllegalArgumentError,(string *)&tx);
    __cxa_throw(pCVar6,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  bVar1 = 0;
LAB_0039bba6:
  is_bitcoin = false;
  cfd::capi::ConvertNetType(net_type,&is_bitcoin);
  cfd::core::Amount::Amount(&value,value_satoshi);
  cfd::core::ByteData::ByteData(&sighash_bytes);
  cfd::core::SigHashType::Create(&sighashtype,(uint8_t)sighash_type,sighash_anyone_can_pay,false);
  if ((bool)(bVar2 | bVar1)) {
    bVar3 = cfd::capi::IsEmptyString(redeem_script);
    if (bVar3) {
      tx.super_Transaction.super_AbstractTransaction._vptr_AbstractTransaction =
           (_func_int **)0x4fe2f6;
      tx.super_Transaction.super_AbstractTransaction.wally_tx_pointer_._0_4_ = 0x942;
      tx.super_Transaction.vin_.
      super__Vector_base<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_2b1128;
      cfd::core::logger::warn<>((CfdSourceLocation *)&tx,"redeem script is null or empty.");
      pCVar6 = (CfdException *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)&tx,"Failed to parameter. redeem script is null or empty.",
                 (allocator *)&local_230);
      cfd::core::CfdException::CfdException(pCVar6,kCfdIllegalArgumentError,(string *)&tx);
      __cxa_throw(pCVar6,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
    }
    if (is_bitcoin != true) {
      std::__cxx11::string::string((string *)&local_230,tx_hex_string,(allocator *)&local_1b0);
      cfd::ConfidentialTransactionContext::ConfidentialTransactionContext
                ((ConfidentialTransactionContext *)&tx,(string *)&local_230);
      std::__cxx11::string::~string((string *)&local_230);
      std::__cxx11::string::string((string *)&local_1f0,txid,&local_236);
      cfd::core::Txid::Txid((Txid *)&local_1d0,&local_1f0);
      cfd::core::OutPoint::OutPoint(&local_1b0,(Txid *)&local_1d0,local_234);
      std::__cxx11::string::string((string *)&local_160,redeem_script,&local_237);
      cfd::core::Script::Script(&local_230,&local_160);
      cfd::core::SigHashType::SigHashType(&local_48,&sighashtype);
      cfd::ConfidentialTransactionContext::CreateSignatureHash
                ((ByteData *)&local_188,(ConfidentialTransactionContext *)&tx,&local_1b0,&local_230,
                 &local_48,&value,version);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&sighash_bytes,&local_188)
      ;
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_188);
      cfd::core::Script::~Script(&local_230);
      std::__cxx11::string::~string((string *)&local_160);
      cfd::core::Txid::~Txid(&local_1b0.txid_);
      cfd::core::Txid::~Txid((Txid *)&local_1d0);
      psVar7 = &local_1f0;
LAB_0039c120:
      std::__cxx11::string::~string((string *)psVar7);
      cfd::ConfidentialTransactionContext::~ConfidentialTransactionContext
                ((ConfidentialTransactionContext *)&tx);
      goto LAB_0039c132;
    }
    std::__cxx11::string::string((string *)&local_230,tx_hex_string,(allocator *)&local_1b0);
    cfd::TransactionContext::TransactionContext(&tx,(string *)&local_230);
    std::__cxx11::string::~string((string *)&local_230);
    std::__cxx11::string::string((string *)&local_1f0,txid,&local_236);
    cfd::core::Txid::Txid((Txid *)&local_1d0,&local_1f0);
    cfd::core::OutPoint::OutPoint(&local_1b0,(Txid *)&local_1d0,local_234);
    std::__cxx11::string::string((string *)&local_160,redeem_script,&local_237);
    cfd::core::Script::Script(&local_230,&local_160);
    cfd::core::SigHashType::SigHashType(&local_3c,&sighashtype);
    cfd::TransactionContext::CreateSignatureHash
              ((ByteData *)&local_188,&tx,&local_1b0,&local_230,&local_3c,&value,version);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&sighash_bytes,&local_188);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_188);
    cfd::core::Script::~Script(&local_230);
    std::__cxx11::string::~string((string *)&local_160);
    cfd::core::Txid::~Txid(&local_1b0.txid_);
    cfd::core::Txid::~Txid((Txid *)&local_1d0);
    psVar7 = &local_1f0;
  }
  else {
    bVar3 = cfd::capi::IsEmptyString(pubkey);
    if (bVar3) {
      tx.super_Transaction.super_AbstractTransaction._vptr_AbstractTransaction =
           (_func_int **)0x4fe2f6;
      tx.super_Transaction.super_AbstractTransaction.wally_tx_pointer_._0_4_ = 0x959;
      tx.super_Transaction.vin_.
      super__Vector_base<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_2b1128;
      cfd::core::logger::warn<>((CfdSourceLocation *)&tx,"pubkey is null or empty.");
      pCVar6 = (CfdException *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)&tx,"Failed to parameter. pubkey is null or empty.",
                 (allocator *)&local_230);
      cfd::core::CfdException::CfdException(pCVar6,kCfdIllegalArgumentError,(string *)&tx);
      __cxa_throw(pCVar6,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
    }
    if (is_bitcoin != true) {
      std::__cxx11::string::string((string *)&local_230,tx_hex_string,(allocator *)&local_1b0);
      cfd::ConfidentialTransactionContext::ConfidentialTransactionContext
                ((ConfidentialTransactionContext *)&tx,(string *)&local_230);
      std::__cxx11::string::~string((string *)&local_230);
      std::__cxx11::string::string((string *)&local_1d0,txid,&local_236);
      cfd::core::Txid::Txid(&local_1b0.txid_,&local_1d0);
      cfd::core::OutPoint::OutPoint((OutPoint *)&local_230,&local_1b0.txid_,local_234);
      std::__cxx11::string::string((string *)&local_1f0,pubkey,&local_237);
      cfd::core::Pubkey::Pubkey((Pubkey *)&local_188,&local_1f0);
      cfd::core::SigHashType::SigHashType(&local_60,&sighashtype);
      cfd::ConfidentialTransactionContext::CreateSignatureHash
                ((ByteData *)&local_160,(ConfidentialTransactionContext *)&tx,(OutPoint *)&local_230
                 ,(Pubkey *)&local_188,&local_60,&value,version);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&sighash_bytes,&local_160)
      ;
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_160);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_188);
      std::__cxx11::string::~string((string *)&local_1f0);
      cfd::core::Txid::~Txid((Txid *)&local_230);
      cfd::core::Txid::~Txid(&local_1b0.txid_);
      psVar7 = &local_1d0;
      goto LAB_0039c120;
    }
    std::__cxx11::string::string((string *)&local_230,tx_hex_string,(allocator *)&local_1b0);
    cfd::TransactionContext::TransactionContext(&tx,(string *)&local_230);
    std::__cxx11::string::~string((string *)&local_230);
    std::__cxx11::string::string((string *)&local_1d0,txid,&local_236);
    cfd::core::Txid::Txid(&local_1b0.txid_,&local_1d0);
    cfd::core::OutPoint::OutPoint((OutPoint *)&local_230,&local_1b0.txid_,local_234);
    std::__cxx11::string::string((string *)&local_1f0,pubkey,&local_237);
    cfd::core::Pubkey::Pubkey((Pubkey *)&local_188,&local_1f0);
    cfd::core::SigHashType::SigHashType(&local_54,&sighashtype);
    cfd::TransactionContext::CreateSignatureHash
              ((ByteData *)&local_160,&tx,(OutPoint *)&local_230,(Pubkey *)&local_188,&local_54,
               &value,version);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&sighash_bytes,&local_160);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_160);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_188);
    std::__cxx11::string::~string((string *)&local_1f0);
    cfd::core::Txid::~Txid((Txid *)&local_230);
    cfd::core::Txid::~Txid(&local_1b0.txid_);
    psVar7 = &local_1d0;
  }
  std::__cxx11::string::~string((string *)psVar7);
  cfd::TransactionContext::~TransactionContext(&tx);
LAB_0039c132:
  cfd::core::ByteData::GetHex_abi_cxx11_((string *)&tx,&sighash_bytes);
  pcVar5 = cfd::capi::CreateString((string *)&tx);
  *sighash = pcVar5;
  std::__cxx11::string::~string((string *)&tx);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&sighash_bytes);
  return 0;
}

Assistant:

int CfdCreateSighash(
    void* handle, int net_type, const char* tx_hex_string, const char* txid,
    uint32_t vout, int hash_type, const char* pubkey,
    const char* redeem_script, int64_t value_satoshi, int sighash_type,
    bool sighash_anyone_can_pay, char** sighash) {
  try {
    cfd::Initialize();
    if (IsEmptyString(tx_hex_string)) {
      warn(CFD_LOG_SOURCE, "tx is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. tx is null or empty.");
    }
    if (IsEmptyString(txid)) {
      warn(CFD_LOG_SOURCE, "txid is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. txid is null or empty.");
    }
    if (sighash == nullptr) {
      warn(CFD_LOG_SOURCE, "sighash is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. sighash is null.");
    }

    AddressType addr_type = ConvertHashToAddressType(hash_type);
    HashType core_hash_type;
    WitnessVersion version = WitnessVersion::kVersionNone;
    switch (addr_type) {
      case AddressType::kP2shAddress:
        core_hash_type = HashType::kP2sh;
        break;
      case AddressType::kP2wshAddress:
        // fall-through
      case AddressType::kP2shP2wshAddress:
        core_hash_type = HashType::kP2wsh;
        version = WitnessVersion::kVersion0;
        break;
      case AddressType::kP2pkhAddress:
        core_hash_type = HashType::kP2pkh;
        break;
      case AddressType::kP2wpkhAddress:
        // fall-through
      case AddressType::kP2shP2wpkhAddress:
        core_hash_type = HashType::kP2wpkh;
        version = WitnessVersion::kVersion0;
        break;
      default:
        warn(CFD_LOG_SOURCE, "hashtype is illegal.");
        throw CfdException(
            CfdError::kCfdIllegalArgumentError,
            "Failed to parameter. hashtype is illegal.");
    }

    bool is_bitcoin = false;
    ConvertNetType(net_type, &is_bitcoin);
    Amount value(value_satoshi);
    ByteData sighash_bytes;
    SigHashType sighashtype = SigHashType::Create(
        static_cast<uint8_t>(sighash_type), sighash_anyone_can_pay);
    if ((core_hash_type == HashType::kP2sh) ||
        (core_hash_type == HashType::kP2wsh)) {
      if (IsEmptyString(redeem_script)) {
        warn(CFD_LOG_SOURCE, "redeem script is null or empty.");
        throw CfdException(
            CfdError::kCfdIllegalArgumentError,
            "Failed to parameter. redeem script is null or empty.");
      }
      if (is_bitcoin) {
        TransactionContext tx(tx_hex_string);
        sighash_bytes = tx.CreateSignatureHash(
            OutPoint(Txid(std::string(txid)), vout), Script(redeem_script),
            sighashtype, value, version);
      } else {
#ifndef CFD_DISABLE_ELEMENTS
        ConfidentialTransactionContext tx(tx_hex_string);
        sighash_bytes = tx.CreateSignatureHash(
            OutPoint(Txid(std::string(txid)), vout), Script(redeem_script),
            sighashtype, value, version);
#else
        throw CfdException(
            CfdError::kCfdIllegalArgumentError, "Elements is not supported.");
#endif  // CFD_DISABLE_ELEMENTS
      }
    } else {
      if (IsEmptyString(pubkey)) {
        warn(CFD_LOG_SOURCE, "pubkey is null or empty.");
        throw CfdException(
            CfdError::kCfdIllegalArgumentError,
            "Failed to parameter. pubkey is null or empty.");
      }
      if (is_bitcoin) {
        TransactionContext tx(tx_hex_string);
        sighash_bytes = tx.CreateSignatureHash(
            OutPoint(Txid(std::string(txid)), vout), Pubkey(pubkey),
            sighashtype, value, version);
      } else {
#ifndef CFD_DISABLE_ELEMENTS
        ConfidentialTransactionContext tx(tx_hex_string);
        sighash_bytes = tx.CreateSignatureHash(
            OutPoint(Txid(std::string(txid)), vout), Pubkey(pubkey),
            sighashtype, value, version);
#else
        throw CfdException(
            CfdError::kCfdIllegalArgumentError, "Elements is not supported.");
#endif  // CFD_DISABLE_ELEMENTS
      }
    }

    *sighash = CreateString(sighash_bytes.GetHex());
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    return SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
    return CfdErrorCode::kCfdUnknownError;
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
    return CfdErrorCode::kCfdUnknownError;
  }
}